

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
ModRequestGameCommand::trigger
          (ModRequestGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  PlayerInfo *this_00;
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  size_type sVar5;
  const_pointer pvVar6;
  size_type sVar7;
  char *pcVar8;
  size_type sVar9;
  const_pointer pvVar10;
  Client *pCVar11;
  Client *server_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>_>_>
  *this_02;
  basic_string_view<char,_std::char_traits<char>_> bVar12;
  string local_140;
  __sv_type local_120;
  reference local_110;
  value_type *channel;
  const_iterator __end3;
  const_iterator __begin3;
  ChannelTableType *__range3;
  Client *server;
  size_t server_index;
  size_t server_count;
  undefined1 auStack_d0 [4];
  uint total_user_alerts;
  anon_class_16_2_e9ecff23 alert_channel;
  string channel_message;
  undefined1 local_90 [8];
  string user_message;
  string fmtName;
  string_view staff_word;
  char *local_38;
  PlayerInfo *player_local;
  Server *source_local;
  ModRequestGameCommand *this_local;
  string_view parameters_local;
  
  parameters_local._M_len = (size_t)parameters._M_str;
  this_local = (ModRequestGameCommand *)parameters._M_len;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (bVar2) {
    bVar12 = sv("Please specify a reason for requesting moderator assistance.",0x3c);
    staff_word._M_str = (char *)bVar12._M_len;
    local_38 = bVar12._M_str;
    RenX::Server::sendMessage(source,player,staff_word._M_str,local_38);
  }
  else {
    join_0x00000010_0x00000000_ = RenX_CommandsPlugin::getStaffTitle(&pluginInstance);
    this_00 = (PlayerInfo *)(&user_message.field_2._M_allocated_capacity + 1);
    RenX::getFormattedPlayerName_abi_cxx11_(this_00);
    pbVar1 = (basic_string_view<char,_std::char_traits<char>_> *)((long)&fmtName.field_2 + 8);
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(pbVar1);
    pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::data(pbVar1);
    sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00)
    ;
    pcVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00
                       );
    sVar9 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::data
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    string_printf_abi_cxx11_
              ((string *)local_90,
               "\x0312[%.*s Request] \x03\x02%.*s\x02\x0307 has requested assistance in-game for \"%.*s\"; please look in "
               ,sVar5,pvVar6,sVar7,pcVar8,sVar9,pvVar10);
    pbVar1 = (basic_string_view<char,_std::char_traits<char>_> *)((long)&fmtName.field_2 + 8);
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(pbVar1);
    pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::data(pbVar1);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&user_message.field_2 + 8);
    sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (this_01);
    pcVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       (this_01);
    sVar9 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::data
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    string_printf_abi_cxx11_
              ((string *)&alert_channel.channel_message,
               "\x0312[%.*s Request] \x03\x02%.*s\x02\x0307 has requested assistance in-game! Reason: %.*s\x03"
               ,sVar5,pvVar6,sVar7,pcVar8,sVar9,pvVar10);
    _auStack_d0 = (string *)local_90;
    alert_channel.user_message = (string *)&alert_channel.channel_message;
    server_count._4_4_ = 0;
    pCVar11 = (Client *)ServerManager::size();
    for (server = (Client *)0x0; server < pCVar11; server = server + 1) {
      server_00 = (Client *)ServerManager::getServer(_serverManager);
      if (server_00 != (Client *)0x0) {
        this_02 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>_>_>
                   *)Jupiter::IRC::Client::getChannels_abi_cxx11_();
        __end3 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>_>_>
                 ::begin(this_02);
        channel = (value_type *)
                  std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>_>_>
                  ::end(this_02);
        while (bVar2 = std::__detail::operator==
                                 (&__end3.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>,_false>
                                  ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>,_false>
                                    *)&channel), ((bVar2 ^ 0xffU) & 1) != 0) {
          local_110 = std::__detail::
                      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>,_false,_false>
                      ::operator*(&__end3);
          Jupiter::IRC::Client::Channel::getType();
          bVar3 = RenX::Server::isAdminLogChanType((int)source);
          if ((bVar3 & 1) != 0) {
            uVar4 = trigger::anon_class_16_2_e9ecff23::operator()
                              ((anon_class_16_2_e9ecff23 *)auStack_d0,server_00,&local_110->second);
            server_count._4_4_ = uVar4 + server_count._4_4_;
          }
          std::__detail::
          _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::IRC::Client::Channel>,_false,_false>
          ::operator++(&__end3);
        }
      }
    }
    pbVar1 = (basic_string_view<char,_std::char_traits<char>_> *)((long)&fmtName.field_2 + 8);
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(pbVar1);
    pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::data(pbVar1);
    string_printf_abi_cxx11_
              (&local_140,"A total of %u %.*ss have been notified of your assistance request.",
               (ulong)server_count._4_4_,sVar5,pvVar6);
    local_120 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_140);
    RenX::Server::sendMessage(source,player,local_120._M_len,local_120._M_str);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&alert_channel.channel_message);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)(user_message.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void ModRequestGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	if (parameters.empty()) {
		source->sendMessage(*player, "Please specify a reason for requesting moderator assistance."sv);
		return;
	}

	std::string_view staff_word = pluginInstance.getStaffTitle();
	std::string fmtName = RenX::getFormattedPlayerName(*player);
	std::string user_message = string_printf(IRCCOLOR "12[%.*s Request] " IRCCOLOR IRCBOLD "%.*s" IRCBOLD IRCCOLOR "07 has requested assistance in-game for \"%.*s\"; please look in ", staff_word.size(),
		staff_word.data(), fmtName.size(), fmtName.data(), parameters.size(),
		parameters.data());
	std::string channel_message = string_printf(IRCCOLOR "12[%.*s Request] " IRCCOLOR IRCBOLD "%.*s" IRCBOLD IRCCOLOR "07 has requested assistance in-game! Reason: %.*s" IRCCOLOR, staff_word.size(),
		staff_word.data(), fmtName.size(), fmtName.data(), parameters.size(),
		parameters.data());

	// Alerts a channel and all relevant users in the channel
	auto alert_channel = [&user_message, &channel_message](Jupiter::IRC::Client& server, const Jupiter::IRC::Client::Channel& channel) {
		// Alert channel
		server.sendMessage(channel.getName(), channel_message);

		// Alert relevant users in the channel
		unsigned int total_user_alerts{};
		size_t base_length = user_message.size();
		user_message += channel.getName();

		for (auto& user : channel.getUsers()) {
			if (channel.getUserPrefix(*user.second) != 0 // If the user has a prefix...
				&& user.second->getNickname() != server.getNickname()) { // And the user isn't this bot...
				// Alert the user
				server.sendMessage(user.second->getNickname(), user_message);
				++total_user_alerts;
			}
		}

		user_message.erase(base_length);
		return total_user_alerts;
	};

	// TODO: clean this up by just exposing a vector of servers...
	// Send off alerts
	unsigned int total_user_alerts{};
	size_t server_count = serverManager->size();
	for (size_t server_index = 0; server_index < server_count; ++server_index) {
		if (Jupiter::IRC::Client *server = serverManager->getServer(server_index)) {
			// Alert all admin channels (and their relevant users)
			for (auto& channel : server->getChannels()) {
				if (source->isAdminLogChanType(channel.second.getType())) {
					total_user_alerts += alert_channel(*server, channel.second);
				}
			}
		}
	}

	// Inform the user of the result
	source->sendMessage(*player, string_printf("A total of %u %.*ss have been notified of your assistance request.", total_user_alerts, staff_word.size(),
		staff_word.data()));
}